

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

void hwnet::ThreadPool::threadFunc(TaskQueue *queue_)

{
  undefined8 *local_30;
  Ptr task;
  
  while( true ) {
    TaskQueue::Get((TaskQueue *)&local_30);
    if (local_30 == (undefined8 *)0x0) break;
    (**(code **)*local_30)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&task);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&task);
  return;
}

Assistant:

void ThreadPool::threadFunc(ThreadPool::TaskQueue *queue_) {
	for(;;) {
		Task::Ptr task = queue_->Get();
		if(task == nullptr) {
			return;
		}
		task->Do();
	}
}